

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

double __thiscall
BeliefSparse::InnerProduct(BeliefSparse *this,vector<double,_std::allocator<double>_> *values)

{
  bool bVar1;
  char *pcVar2;
  const_reference pvVar3;
  int __c;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *in_RSI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  BScit it;
  double x;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff88;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *in_stack_ffffffffffffff90;
  const_iterator *in_stack_ffffffffffffffa0;
  char local_38 [16];
  const_iterator local_28;
  double local_18;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *local_10;
  
  local_18 = 0.0;
  local_10 = in_RSI;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin(in_stack_ffffffffffffff88);
  while( true ) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::end(in_stack_ffffffffffffff88);
    pcVar2 = local_38;
    bVar1 = boost::numeric::ublas::
            bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
            ::operator!=(in_stack_ffffffffffffff90,
                         (derived_iterator_type *)in_stack_ffffffffffffff88);
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::~const_iterator((const_iterator *)0x9c2a94);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (const_iterator *)
         boost::numeric::ublas::
         compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         ::const_iterator::operator*(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff88 =
         (in_stack_ffffffffffffffa0->
         super_container_const_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
         ).c_;
    in_stack_ffffffffffffff90 = local_10;
    pcVar2 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::index(&local_28,pcVar2,__c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
                        (size_type)pcVar2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_stack_ffffffffffffff88;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pvVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_18;
    auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
    local_18 = auVar4._0_8_;
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::operator++(&local_28);
  }
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x9c2aa6);
  return local_18;
}

Assistant:

double BeliefSparse::InnerProduct(const vector<double> &values) const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    double x=0;
    for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
        x+=(*it)*values[it.index()];

    return(x);
}